

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O0

void timer_close_cb(uv_handle_t *timer)

{
  uv_fs_poll_t *handle_00;
  poll_ctx *ptr;
  uv_fs_poll_t *handle;
  poll_ctx *last;
  poll_ctx *it;
  poll_ctx *ctx;
  uv_handle_t *timer_local;
  
  ptr = (poll_ctx *)((long)&timer[-1].u + 8);
  handle_00 = ptr->parent_handle;
  if (ptr == (poll_ctx *)handle_00->poll_ctx) {
    handle_00->poll_ctx = timer[7].next_closing;
    if ((handle_00->poll_ctx == (void *)0x0) && ((handle_00->flags & 3) != 0)) {
      uv__make_close_pending((uv_handle_t *)handle_00);
    }
  }
  else {
    handle = (uv_fs_poll_t *)handle_00->poll_ctx;
    for (last = (poll_ctx *)handle[7].u.reserved[2]; last != ptr; last = last->previous) {
      if (handle[7].u.reserved[2] == (void *)0x0) {
        __assert_fail("last->previous != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/fs-poll.c"
                      ,0xfa,"void timer_close_cb(uv_handle_t *)");
      }
      handle = (uv_fs_poll_t *)last;
    }
    handle[7].u.reserved[2] = timer[7].next_closing;
  }
  uv__free(ptr);
  return;
}

Assistant:

static void timer_close_cb(uv_handle_t* timer) {
  struct poll_ctx* ctx;
  struct poll_ctx* it;
  struct poll_ctx* last;
  uv_fs_poll_t* handle;

  ctx = container_of(timer, struct poll_ctx, timer_handle);
  handle = ctx->parent_handle;
  if (ctx == handle->poll_ctx) {
    handle->poll_ctx = ctx->previous;
    if (handle->poll_ctx == NULL && uv__is_closing(handle))
      uv__make_close_pending((uv_handle_t*)handle);
  } else {
    for (last = handle->poll_ctx, it = last->previous;
         it != ctx;
         last = it, it = it->previous) {
      assert(last->previous != NULL);
    }
    last->previous = ctx->previous;
  }
  uv__free(ctx);
}